

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cc
# Opt level: O0

void brotli::RefineEntropyCodes<brotli::Histogram<520>,unsigned_short>
               (unsigned_short *data,size_t length,size_t stride,
               vector<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_> *vec)

{
  double dVar1;
  long lVar2;
  size_type sVar3;
  size_type sVar4;
  size_type sVar5;
  reference this;
  size_t ix;
  Histogram<520> sample;
  size_t iter;
  double dStack_30;
  uint seed;
  size_t iters;
  vector<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_> *vec_local;
  size_t stride_local;
  size_t length_local;
  unsigned_short *data_local;
  
  lVar2 = (length << 1) / stride + 100;
  iter._4_4_ = 7;
  dStack_30 = (double)lVar2;
  iters = (size_t)vec;
  vec_local = (vector<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_> *)stride;
  stride_local = length;
  length_local = (size_t)data;
  sVar3 = std::vector<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>::size(vec);
  sVar4 = std::vector<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>::size
                    ((vector<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_> *)
                     iters);
  sVar5 = std::vector<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>::size
                    ((vector<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_> *)
                     iters);
  dStack_30 = (double)((((lVar2 + sVar3) - 1) / sVar4) * sVar5);
  for (sample.bit_cost_ = 0.0; (ulong)sample.bit_cost_ < (ulong)dStack_30;
      sample.bit_cost_ = (double)((long)sample.bit_cost_ + 1)) {
    Histogram<520>::Histogram((Histogram<520> *)&ix);
    RandomSample<brotli::Histogram<520>,unsigned_short>
              ((uint *)((long)&iter + 4),(unsigned_short *)length_local,stride_local,
               (size_t)vec_local,(Histogram<520> *)&ix);
    dVar1 = sample.bit_cost_;
    sVar3 = std::vector<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>::size
                      ((vector<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_> *)
                       iters);
    this = std::vector<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_>::operator[]
                     ((vector<brotli::Histogram<520>,_std::allocator<brotli::Histogram<520>_>_> *)
                      iters,(ulong)dVar1 % sVar3);
    Histogram<520>::AddHistogram(this,(Histogram<520> *)&ix);
  }
  return;
}

Assistant:

void RefineEntropyCodes(const DataType* data, size_t length,
                        size_t stride,
                        std::vector<HistogramType>* vec) {
  size_t iters =
      kIterMulForRefining * length / stride + kMinItersForRefining;
  unsigned int seed = 7;
  iters = ((iters + vec->size() - 1) / vec->size()) * vec->size();
  for (size_t iter = 0; iter < iters; ++iter) {
    HistogramType sample;
    RandomSample(&seed, data, length, stride, &sample);
    size_t ix = iter % vec->size();
    (*vec)[ix].AddHistogram(sample);
  }
}